

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::java::ClassNameResolver::HasConflictingClassName
          (ClassNameResolver *this,FileDescriptor *file,string_view classname,
          NameEquality equality_mode)

{
  bool bVar1;
  int iVar2;
  NameEquality NVar3;
  EnumDescriptor *this_00;
  ServiceDescriptor *this_01;
  Descriptor *this_02;
  NameEquality equality_mode_00;
  string_view sVar4;
  int local_84;
  int i_2;
  int local_5c;
  int i_1;
  int local_38;
  int i;
  NameEquality equality_mode_local;
  FileDescriptor *file_local;
  ClassNameResolver *this_local;
  string_view classname_local;
  
  local_38 = 0;
  equality_mode_00 = equality_mode;
  while( true ) {
    iVar2 = FileDescriptor::enum_type_count(file);
    if (iVar2 <= local_38) {
      local_5c = 0;
      while( true ) {
        iVar2 = FileDescriptor::service_count(file);
        if (iVar2 <= local_5c) {
          local_84 = 0;
          while( true ) {
            iVar2 = FileDescriptor::message_type_count(file);
            if (iVar2 <= local_84) {
              return false;
            }
            this_02 = FileDescriptor::message_type(file,local_84);
            sVar4._M_str._0_4_ = equality_mode;
            sVar4._M_len = (size_t)classname._M_str;
            sVar4._M_str._4_4_ = 0;
            bVar1 = java::anon_unknown_0::MessageHasConflictingClassName
                              ((anon_unknown_0 *)this_02,(Descriptor *)classname._M_len,sVar4,
                               equality_mode_00);
            if (bVar1) break;
            local_84 = local_84 + 1;
          }
          return true;
        }
        this_01 = FileDescriptor::service(file,local_5c);
        sVar4 = ServiceDescriptor::name(this_01);
        NVar3 = java::anon_unknown_0::CheckNameEquality(sVar4,classname);
        if (NVar3 == equality_mode) break;
        local_5c = local_5c + 1;
      }
      return true;
    }
    this_00 = FileDescriptor::enum_type(file,local_38);
    sVar4 = EnumDescriptor::name(this_00);
    NVar3 = java::anon_unknown_0::CheckNameEquality(sVar4,classname);
    if (NVar3 == equality_mode) break;
    local_38 = local_38 + 1;
  }
  return true;
}

Assistant:

bool ClassNameResolver::HasConflictingClassName(const FileDescriptor* file,
                                                absl::string_view classname,
                                                NameEquality equality_mode) {
  for (int i = 0; i < file->enum_type_count(); i++) {
    if (CheckNameEquality(file->enum_type(i)->name(), classname) ==
        equality_mode) {
      return true;
    }
  }
  for (int i = 0; i < file->service_count(); i++) {
    if (CheckNameEquality(file->service(i)->name(), classname) ==
        equality_mode) {
      return true;
    }
  }
  for (int i = 0; i < file->message_type_count(); i++) {
    if (MessageHasConflictingClassName(file->message_type(i), classname,
                                       equality_mode)) {
      return true;
    }
  }
  return false;
}